

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmanager.cpp
# Opt level: O0

void __thiscall camp::detail::ClassManager::~ClassManager(ClassManager *this)

{
  bool bVar1;
  ClassInfo *pCVar2;
  element_type *theClass;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>
  local_20;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>
  local_18;
  const_iterator it;
  ClassManager *this_local;
  
  it.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
             *)this;
  local_18.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>,_boost::mpl::v_item<camp::detail::ClassManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::begin(&(this->m_classes).super_type.super_type);
  while( true ) {
    local_20.node =
         (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>
          *)boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::multi_index::detail::nth_layer<1,_camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>,_boost::mpl::v_item<camp::detail::ClassManager::Id,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::end(&(this->m_classes).super_type.super_type);
    bVar1 = boost::operators_impl::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pCVar2 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_const_camp::detail::ClassManager::ClassInfo_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::detail::ClassManager::ClassInfo,_long,_const_camp::detail::ClassManager::ClassInfo_*,_const_camp::detail::ClassManager::ClassInfo_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_const_camp::detail::ClassManager::ClassInfo_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::detail::ClassManager::ClassInfo,_long,_const_camp::detail::ClassManager::ClassInfo_*,_const_camp::detail::ClassManager::ClassInfo_&>_>_>
                           *)&local_18);
    theClass = std::__shared_ptr_access<camp::Class,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<camp::Class,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pCVar2->classPtr);
    ObserverNotifier::notifyClassRemoved(&this->super_ObserverNotifier,theClass);
    boost::multi_index::detail::
    bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::ClassManager::ClassInfo,_std::allocator<camp::detail::ClassManager::ClassInfo>_>_>_>_>
    ::operator++(&local_18);
  }
  boost::multi_index::
  multi_index_container<camp::detail::ClassManager::ClassInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::ClassManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::ClassManager::ClassInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::ClassManager::ClassInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::ClassManager::ClassInfo>_>
  ::~multi_index_container(&this->m_classes);
  ObserverNotifier::~ObserverNotifier(&this->super_ObserverNotifier);
  return;
}

Assistant:

ClassManager::~ClassManager()
{
    // Notify observers
    for (ClassTable::const_iterator it = m_classes.begin(); it != m_classes.end(); ++it)
    {
        notifyClassRemoved(*it->classPtr);
    }
}